

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetDimTextOrientation(ON_DimStyle *this,TextOrientation orientation)

{
  undefined8 uVar1;
  
  if (this->m_dim_text_orientation != orientation) {
    this->m_dim_text_orientation = orientation;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_text_position_properties_hash).m_digest =
         ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8) = uVar1;
    *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,DimTextOrientation);
  return;
}

Assistant:

void ON_DimStyle::SetDimTextOrientation(ON::TextOrientation orientation)
{
  if (m_dim_text_orientation != orientation)
  {
    m_dim_text_orientation = orientation;
    Internal_TextPositionPropertiesChange();
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::DimTextOrientation);
}